

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_fe_non_zero_test(secp256k1_fe *fe)

{
  int iVar1;
  secp256k1_fe *in_RDI;
  secp256k1_fe *in_stack_00000010;
  
  do {
    testutil_random_fe_test(in_stack_00000010);
    iVar1 = secp256k1_fe_impl_is_zero(in_RDI);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void testutil_random_fe_non_zero_test(secp256k1_fe *fe) {
    do {
        testutil_random_fe_test(fe);
    } while(secp256k1_fe_is_zero(fe));
}